

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateRankExists(Result *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  string *psVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string err;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ == 0) ||
     ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ == 0)) {
    psVar1 = (layer->name_).ptr_;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar2,pcVar2 + psVar1->_M_string_length);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x6144ab);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_50 = *plVar4;
      lStack_48 = plVar3[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar4;
      local_60 = (long *)*plVar3;
    }
    local_58 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_80.field_2._M_allocated_capacity = *psVar5;
      local_80.field_2._8_8_ = plVar3[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar5;
      local_80._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_80._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRankExists(const Specification::NeuralNetworkLayer& layer) {
    
    if (layer.inputtensor_size() == 0 || layer.outputtensor_size() == 0) {
        std::string err = "Layer '" + std::string(layer.name()) + "' must have rank specified for its input and output.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}